

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall
script_stack_entry::script_stack_entry
          (script_stack_entry *this,script_stack_entry *encp,int old_more,CVmNetFile *netfile,
          osfildef *outfp,vm_val_t *filespec,int new_more,int is_quiet,int is_event_script)

{
  undefined8 *puVar1;
  vm_globalvar_t *pvVar2;
  CVmObjTable *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 *in_R9;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 3) = in_EDX;
  in_RDI[1] = in_RCX;
  in_RDI[2] = in_R8;
  *(undefined4 *)((long)in_RDI + 0x1c) = filespec._0_4_;
  *(undefined4 *)(in_RDI + 4) = outfp._0_4_;
  *(undefined4 *)((long)in_RDI + 0x24) = netfile._0_4_;
  in_RDI[5] = 0;
  if (in_R9 != (undefined8 *)0x0) {
    pvVar2 = CVmObjTable::create_global_var(in_RCX);
    in_RDI[5] = pvVar2;
    puVar1 = (undefined8 *)in_RDI[5];
    *puVar1 = *in_R9;
    puVar1[1] = in_R9[1];
  }
  return;
}

Assistant:

script_stack_entry::script_stack_entry(
    VMG_ script_stack_entry *encp, int old_more,
    class CVmNetFile *netfile, osfildef *outfp, const vm_val_t *filespec,
    int new_more, int is_quiet, int is_event_script)
{
    /* remember the stack level settings */
    this->enc = encp;
    this->old_more_mode = old_more;
    this->netfile = netfile;
    this->fp = outfp;
    this->more_mode = new_more;
    this->quiet = is_quiet;
    this->event_script = is_event_script;

    /* if we have a file spec, create a global for it for gc protection */
    this->filespec = 0;
    if (filespec != 0)
    {
        this->filespec = G_obj_table->create_global_var();
        this->filespec->val = *filespec;
    }
}